

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O3

void __thiscall
duckdb::MergeCollectionTask::Execute
          (MergeCollectionTask *this,PhysicalBatchInsert *op,ClientContext *context,
          GlobalSinkState *g_state_p,LocalSinkState *l_state_p)

{
  pointer *this_00;
  pthread_mutex_t *__mutex;
  pointer pRVar1;
  ulong uVar2;
  int iVar3;
  DataTable *pDVar4;
  OptimisticDataWriter *this_01;
  type writer;
  PhysicalIndex collection_index;
  RowGroupCollection *this_02;
  __pthread_internal_list *p_Var5;
  InternalException *this_03;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  string local_50;
  
  this_00 = &l_state_p[6].partition_info.partition_data.
             super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
             .
             super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (l_state_p[6].partition_info.partition_data.
      super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
    pDVar4 = (DataTable *)
             (**(code **)(**(long **)&g_state_p[4].super_StateWithBlockableTasks.lock.
                                      super___mutex_base._M_mutex + 0x80))();
    this_01 = (OptimisticDataWriter *)operator_new(0x10);
    OptimisticDataWriter::OptimisticDataWriter(this_01,pDVar4);
    ::std::
    __uniq_ptr_impl<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
    ::reset((__uniq_ptr_impl<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
             *)this_00,this_01);
  }
  writer = unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
           ::operator*((unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
                        *)this_00);
  collection_index =
       BatchInsertGlobalState::MergeCollections
                 ((BatchInsertGlobalState *)g_state_p,context,&this->merge_collections,writer);
  pRVar1 = (this->merge_collections).
           super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
           super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->merge_collections).
      super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
      super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish != pRVar1) {
    (this->merge_collections).
    super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
    super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish = pRVar1;
  }
  __mutex = (pthread_mutex_t *)
            &g_state_p[3].super_StateWithBlockableTasks.blocked_tasks.
             super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 != 0) {
    ::std::__throw_system_error(iVar3);
  }
  pDVar4 = (DataTable *)
           (**(code **)(**(long **)&g_state_p[4].super_StateWithBlockableTasks.lock.
                                    super___mutex_base._M_mutex + 0x80))();
  this_02 = DataTable::GetOptimisticCollection(pDVar4,context,collection_index);
  uVar2 = this->merged_batch_index;
  RowGroupCollection::GetTotalRows(this_02);
  p_Var5 = g_state_p[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list
           .__prev;
  uVar6 = (long)g_state_p[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
                __list.__next - (long)p_Var5;
  if (0 < (long)uVar6) {
    uVar6 = (uVar6 >> 3) * -0x3333333333333333;
    do {
      uVar7 = uVar6 >> 1;
      uVar8 = uVar7;
      if (*(ulong *)((long)p_Var5 + uVar7 * 0x28) < uVar2) {
        uVar8 = ~uVar7 + uVar6;
        p_Var5 = (__pthread_internal_list *)((long)p_Var5 + (uVar7 * 5 + 5) * 8);
      }
      uVar6 = uVar8;
    } while (0 < (long)uVar8);
  }
  if (p_Var5->__prev == (__pthread_internal_list *)this->merged_batch_index) {
    p_Var5[1].__next = (__pthread_internal_list *)collection_index.index;
    pthread_mutex_unlock(__mutex);
    return;
  }
  this_03 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Merged batch index was no longer present in collection","");
  InternalException::InternalException(this_03,&local_50);
  __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Execute(const PhysicalBatchInsert &op, ClientContext &context, GlobalSinkState &g_state_p,
	             LocalSinkState &l_state_p) override {
		auto &g_state = g_state_p.Cast<BatchInsertGlobalState>();
		auto &l_state = l_state_p.Cast<BatchInsertLocalState>();

		// Merge the collections.
		if (!l_state.optimistic_writer) {
			l_state.optimistic_writer = make_uniq<OptimisticDataWriter>(g_state.table.GetStorage());
		}
		auto result_collection_index = g_state.MergeCollections(context, merge_collections, *l_state.optimistic_writer);
		merge_collections.clear();

		lock_guard<mutex> l(g_state.lock);
		auto &result_collection = g_state.table.GetStorage().GetOptimisticCollection(context, result_collection_index);
		RowGroupBatchEntry new_entry(result_collection, merged_batch_index, result_collection_index,
		                             RowGroupBatchType::FLUSHED);

		// Add the result collection to the set of batch indexes.
		auto it = std::lower_bound(
		    g_state.collections.begin(), g_state.collections.end(), new_entry,
		    [&](const RowGroupBatchEntry &a, const RowGroupBatchEntry &b) { return a.batch_idx < b.batch_idx; });
		if (it->batch_idx != merged_batch_index) {
			throw InternalException("Merged batch index was no longer present in collection");
		}
		it->collection_index = new_entry.collection_index;
	}